

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_manager.cpp
# Opt level: O2

void __thiscall CfdCoreManager_Initialize_Test::TestBody(CfdCoreManager_Initialize_Test *this)

{
  bool bVar1;
  AssertHelper local_70;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_68;
  CfdCoreHandle handle;
  CfdCoreManagerFinalizedTest finalize_test;
  
  CfdCoreManagerFinalizedTest::CfdCoreManagerFinalizedTest(&finalize_test);
  handle = (CfdCoreHandle)0x0;
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    cfd::core::CfdCoreManager::Initialize((void **)&finalize_test);
  }
  testing::Message::Message((Message *)&local_68);
  testing::internal::AssertHelper::AssertHelper
            (&local_70,kNonFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/test/test_manager.cpp"
             ,0x3b,
             "Expected: (finalize_test.Initialize(&handle)) throws an exception of type CfdException.\n  Actual: it throws nothing."
            );
  testing::internal::AssertHelper::operator=(&local_70,(Message *)&local_68);
  testing::internal::AssertHelper::~AssertHelper(&local_70);
  testing::internal::
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~scoped_ptr(&local_68);
  cfd::core::CfdCoreManager::~CfdCoreManager(&finalize_test.super_CfdCoreManager);
  return;
}

Assistant:

TEST(CfdCoreManager, Initialize) {
  CfdCoreManagerFinalizedTest finalize_test;
  CfdCoreHandle handle = nullptr;
  EXPECT_THROW((finalize_test.Initialize(&handle)), CfdException);
}